

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

void __thiscall
rtosc::ClonePorts::ClonePorts(ClonePorts *this,Ports *ports_,initializer_list<rtosc::ClonePort> c)

{
  bool bVar1;
  int iVar2;
  reference pPVar3;
  undefined8 in_RSI;
  function<void_(const_char_*,_rtosc::RtData_&)> *in_RDI;
  Port *p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<rtosc::Port,_std::allocator<rtosc::Port>_> *__range2;
  Port *clone_port;
  ClonePort *to_clone;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<rtosc::ClonePort> *__range1;
  value_type *in_stack_ffffffffffffff28;
  function<void_(const_char_*,_rtosc::RtData_&)> *in_stack_ffffffffffffff30;
  function<void_(const_char_*,_rtosc::RtData_&)> *pfVar4;
  function<void_(const_char_*,_rtosc::RtData_&)> *in_stack_ffffffffffffff40;
  function<void_(const_char_*,_rtosc::RtData_&)> *in_stack_ffffffffffffff48;
  function<void_(const_char_*,_rtosc::RtData_&)> *in_stack_ffffffffffffff50;
  Ports *in_stack_ffffffffffffff60;
  Ports *in_stack_ffffffffffffff70;
  initializer_list<rtosc::Port> in_stack_ffffffffffffff78;
  __normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
  local_68;
  undefined8 local_60;
  reference local_58;
  const_iterator local_50;
  const_iterator local_48;
  const_iterator local_40;
  initializer_list<rtosc::ClonePort> *local_38;
  initializer_list<rtosc::Port> local_30;
  undefined8 local_20;
  initializer_list<rtosc::ClonePort> local_10;
  
  local_20 = in_RSI;
  std::initializer_list<rtosc::Port>::initializer_list(&local_30);
  Ports::Ports(in_stack_ffffffffffffff70,in_stack_ffffffffffffff78);
  local_38 = &local_10;
  local_40 = std::initializer_list<rtosc::ClonePort>::begin(local_38);
  local_48 = std::initializer_list<rtosc::ClonePort>::end
                       ((initializer_list<rtosc::ClonePort> *)in_stack_ffffffffffffff30);
  for (; local_40 != local_48; local_40 = local_40 + 1) {
    local_50 = local_40;
    local_58 = (reference)0x0;
    local_60 = local_20;
    local_68._M_current =
         (Port *)std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::begin
                           ((vector<rtosc::Port,_std::allocator<rtosc::Port>_> *)
                            in_stack_ffffffffffffff28);
    std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::end
              ((vector<rtosc::Port,_std::allocator<rtosc::Port>_> *)in_stack_ffffffffffffff28);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
                          *)in_stack_ffffffffffffff30,
                         (__normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
                          *)in_stack_ffffffffffffff28);
      if (!bVar1) break;
      pPVar3 = __gnu_cxx::
               __normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
               ::operator*(&local_68);
      iVar2 = strcmp(pPVar3->name,local_50->name);
      if (iVar2 == 0) {
        local_58 = pPVar3;
      }
      __gnu_cxx::
      __normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
      ::operator++(&local_68);
    }
    if (local_58 == (reference)0x0) {
      iVar2 = strcmp("*",local_50->name);
      if (iVar2 != 0) {
        fprintf(_stderr,"Cannot find a clone port for \'%s\'\n",local_50->name);
      }
    }
    if (local_58 == (reference)0x0) {
      std::function<void_(const_char_*,_rtosc::RtData_&)>::operator=
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    else {
      in_stack_ffffffffffffff50 = (function<void_(const_char_*,_rtosc::RtData_&)> *)local_58->name;
      in_stack_ffffffffffffff60 = local_58->ports;
      pfVar4 = in_RDI;
      std::function<void_(const_char_*,_rtosc::RtData_&)>::function
                (in_stack_ffffffffffffff40,in_RDI);
      std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::push_back
                ((vector<rtosc::Port,_std::allocator<rtosc::Port>_> *)in_RDI,
                 in_stack_ffffffffffffff28);
      Port::~Port((Port *)0x106666);
      in_stack_ffffffffffffff30 = in_RDI;
      in_RDI = pfVar4;
    }
  }
  Ports::refreshMagic(in_stack_ffffffffffffff60);
  return;
}

Assistant:

ClonePorts::ClonePorts(const Ports &ports_,
        std::initializer_list<ClonePort> c)
    :Ports({})
{
    for(auto &to_clone:c) {
        const Port *clone_port = NULL;
        for(auto &p:ports_.ports)
            if(!strcmp(p.name, to_clone.name))
                clone_port = &p;
        if(!clone_port && strcmp("*", to_clone.name)) {
            fprintf(stderr, "Cannot find a clone port for '%s'\n",to_clone.name);
            assert(false);
        }

        if(clone_port) {
            ports.push_back({clone_port->name, clone_port->metadata,
                    clone_port->ports, to_clone.cb});
        } else {
            default_handler = to_clone.cb;
        }
    }

    refreshMagic();
}